

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void V_unite_cube_extraction
               (tetgenio *out,int *draw_check,double *total_distance,double *draw_points,
               int *draw_check_array,int *num_draw_points,float *x1,float *y1,float *z1,float *x2,
               float *y2,float *z2,int *draw_index,int *point_index)

{
  float fVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  int local_48;
  int local_44;
  int boundary;
  int i;
  double min_strut;
  int *num_draw_points_local;
  int *draw_check_array_local;
  double *draw_points_local;
  double *total_distance_local;
  int *draw_check_local;
  tetgenio *out_local;
  
  *total_distance = 0.0;
  *draw_index = 0;
  *point_index = 0;
  *num_draw_points = 0;
  _boundary = 100.0;
  local_44 = 0;
  min_strut = (double)num_draw_points;
  num_draw_points_local = draw_check_array;
  draw_check_array_local = (int *)draw_points;
  draw_points_local = total_distance;
  total_distance_local = (double *)draw_check;
  draw_check_local = &out->firstnumber;
  for (; local_44 < draw_check_local[0x59]; local_44 = local_44 + 1) {
    *x1 = (float)*(double *)
                  (*(long *)(draw_check_local + 0x50) +
                  (long)(*(int *)(*(long *)(draw_check_local + 0x52) + (long)local_44 * 0x20) * 3) *
                  8);
    *y1 = (float)*(double *)
                  (*(long *)(draw_check_local + 0x50) +
                  (long)(*(int *)(*(long *)(draw_check_local + 0x52) + (long)local_44 * 0x20) * 3 +
                        1) * 8);
    *z1 = (float)*(double *)
                  (*(long *)(draw_check_local + 0x50) +
                  (long)(*(int *)(*(long *)(draw_check_local + 0x52) + (long)local_44 * 0x20) * 3 +
                        2) * 8);
    dVar4 = (double)*(int *)(*(long *)(draw_check_local + 0x52) + (long)local_44 * 0x20 + 4);
    if ((dVar4 != -1.0) || (NAN(dVar4))) {
      *x2 = (float)*(double *)
                    (*(long *)(draw_check_local + 0x50) +
                    (long)(*(int *)(*(long *)(draw_check_local + 0x52) + (long)local_44 * 0x20 + 4)
                          * 3) * 8);
      *y2 = (float)*(double *)
                    (*(long *)(draw_check_local + 0x50) +
                    (long)(*(int *)(*(long *)(draw_check_local + 0x52) + (long)local_44 * 0x20 + 4)
                           * 3 + 1) * 8);
      *z2 = (float)*(double *)
                    (*(long *)(draw_check_local + 0x50) +
                    (long)(*(int *)(*(long *)(draw_check_local + 0x52) + (long)local_44 * 0x20 + 4)
                           * 3 + 2) * 8);
    }
    else {
      *x2 = (float)*(double *)(*(long *)(draw_check_local + 0x52) + (long)local_44 * 0x20 + 8);
      *y2 = (float)*(double *)(*(long *)(draw_check_local + 0x52) + (long)local_44 * 0x20 + 0x10);
      *z2 = (float)*(double *)(*(long *)(draw_check_local + 0x52) + (long)local_44 * 0x20 + 0x18);
    }
    if (((((((*x1 <= 1.0) && (*y1 <= 1.0)) && (*z1 <= 1.0)) && ((0.0 <= *x1 && (0.0 <= *y1)))) &&
         (0.0 <= *z1)) ||
        (((*x2 <= 1.0 && (*y2 <= 1.0)) &&
         ((*z2 <= 1.0 && (((0.0 <= *x2 && (0.0 <= *y2)) && (0.0 <= *z2)))))))) &&
       (((dVar4 = (double)*(int *)(*(long *)(draw_check_local + 0x52) + (long)local_44 * 0x20 + 4),
         dVar4 != -1.0 || (NAN(dVar4))) ||
        ((*x1 < 1.0 &&
         (((*y1 < 1.0 && (*z1 < 1.0)) && ((0.0 < *x1 && ((0.0 < *y1 && (0.0 < *z1)))))))))))) {
      local_48 = 0;
      trim(x1,y1,z1,x2,y2,z2,&local_48,(int *)total_distance_local);
      dVar4 = dist_two_points_3d((double)*x1,(double)*y1,(double)*z1,(double)*x2,(double)*y2,
                                 (double)*z2);
      if (dVar4 < _x0 / 2.0) {
        dVar4 = dist_two_points_3d((double)*x1,(double)*y1,(double)*z1,(double)*x2,(double)*y2,
                                   (double)*z2);
        if (dVar4 * 0.25 < _boundary) {
          _boundary = dist_two_points_3d((double)*x1,(double)*y1,(double)*z1,(double)*x2,(double)*y2
                                         ,(double)*z2);
          _boundary = _boundary * 0.25;
        }
        dVar4 = *draw_points_local;
        dVar5 = dist_two_points_3d((double)*x1,(double)*y1,(double)*z1,(double)*x2,(double)*y2,
                                   (double)*z2);
        *draw_points_local = dVar5 * 0.25 + dVar4;
        fVar1 = *x1;
        iVar2 = *point_index;
        *point_index = iVar2 + 1;
        *(double *)(draw_check_array_local + (long)iVar2 * 2) = (double)fVar1 * 0.25;
        fVar1 = *y1;
        iVar2 = *point_index;
        *point_index = iVar2 + 1;
        *(double *)(draw_check_array_local + (long)iVar2 * 2) = (double)fVar1 * 0.25;
        fVar1 = *z1;
        iVar2 = *point_index;
        *point_index = iVar2 + 1;
        *(double *)(draw_check_array_local + (long)iVar2 * 2) = (double)fVar1 * 0.25;
        fVar1 = *x2;
        iVar2 = *point_index;
        *point_index = iVar2 + 1;
        *(double *)(draw_check_array_local + (long)iVar2 * 2) = (double)fVar1 * 0.25;
        fVar1 = *y2;
        iVar2 = *point_index;
        *point_index = iVar2 + 1;
        *(double *)(draw_check_array_local + (long)iVar2 * 2) = (double)fVar1 * 0.25;
        fVar1 = *z2;
        iVar2 = *point_index;
        *point_index = iVar2 + 1;
        *(double *)(draw_check_array_local + (long)iVar2 * 2) = (double)fVar1 * 0.25;
        *(int *)min_strut = *(int *)min_strut + 1;
        iVar2 = *(int *)total_distance_local;
        iVar3 = *draw_index;
        *draw_index = iVar3 + 1;
        num_draw_points_local[iVar3] = iVar2;
      }
    }
  }
  return;
}

Assistant:

void V_unite_cube_extraction(tetgenio &out, int &draw_check, double &total_distance, double *draw_points, int *draw_check_array, int &num_draw_points,
							 float &x1, float &y1, float &z1, float &x2, float &y2, float &z2, int &draw_index, int &point_index)
{
	total_distance = 0;
	draw_index = 0;
	point_index = 0;
	num_draw_points = 0;
	double min_strut = 100;
	for (int i = 0; i < out.numberofvedges; i++)
	{
		x1 = out.vpointlist[3 * out.vedgelist[i].v1];
		y1 = out.vpointlist[3 * out.vedgelist[i].v1 + 1];
		z1 = out.vpointlist[3 * out.vedgelist[i].v1 + 2];

		if (out.vedgelist[i].v2 == -1.0)
		{
			x2 = out.vedgelist[i].vnormal[0];
			y2 = out.vedgelist[i].vnormal[1];
			z2 = out.vedgelist[i].vnormal[2];
			//cout<<"edge "<<i<<endl;
		}
		else
		{
			x2 = out.vpointlist[3 * out.vedgelist[i].v2];
			y2 = out.vpointlist[3 * out.vedgelist[i].v2 + 1];
			z2 = out.vpointlist[3 * out.vedgelist[i].v2 + 2];
		}

		// check if the line located inside the unit cube
		if ((x1 > 1.0 || y1 > 1.0 || z1 > 1.0 || x1 < 0.0 || y1 < 0.0 || z1 < 0.0) && (x2 > 1.0 || y2 > 1.0 || z2 > 1.0 || x2 < 0.0 || y2 < 0.0 || z2 < 0.0))
		{
		}
		else if ((out.vedgelist[i].v2 == -1.0) && (x1 >= 1.0 || y1 >= 1.0 || z1 >= 1.0 || x1 <= 0.0 || y1 <= 0.0 || z1 <= 0.0))
		{
		}
		else
		{
			int boundary = 0;
			trim(x1, y1, z1, x2, y2, z2, boundary, draw_check);

			if (dist_two_points_3d(x1, y1, z1, x2, y2, z2) < _x0 / 2)
			{
				if (dist_two_points_3d(x1, y1, z1, x2, y2, z2) * 0.25 < min_strut)
				{
					min_strut = dist_two_points_3d(x1, y1, z1, x2, y2, z2) * 0.25;
				}
				total_distance = total_distance + dist_two_points_3d(x1, y1, z1, x2, y2, z2) * 0.25;
				draw_points[point_index++] = x1 * 0.25;
				draw_points[point_index++] = y1 * 0.25;
				draw_points[point_index++] = z1 * 0.25;
				draw_points[point_index++] = x2 * 0.25;
				draw_points[point_index++] = y2 * 0.25;
				draw_points[point_index++] = z2 * 0.25;
				num_draw_points++;
				draw_check_array[draw_index++] = draw_check;
			}
		}
	}
}